

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<capnp::EzRpcServer::Impl::ServerContext>::dispose
          (Own<capnp::EzRpcServer::Impl::ServerContext> *this)

{
  ServerContext *object;
  ServerContext *ptrCopy;
  Own<capnp::EzRpcServer::Impl::ServerContext> *this_local;
  
  object = this->ptr;
  if (object != (ServerContext *)0x0) {
    this->ptr = (ServerContext *)0x0;
    Disposer::dispose<capnp::EzRpcServer::Impl::ServerContext>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }